

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O0

void png_read_filter_row_paeth4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  longlong in_RCX;
  png_const_bytep ppVar1;
  longlong in_R8;
  longlong in_R9;
  __m128i alVar2;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i c_00;
  __m128i c_01;
  __m128i t;
  __m128i t_00;
  __m128i e;
  __m128i e_00;
  __m128i d;
  __m128i a;
  __m128i b;
  __m128i c;
  __m128i nearest;
  __m128i smallest;
  __m128i pc;
  __m128i pb;
  __m128i pa;
  __m128i zero;
  size_t rb;
  png_const_bytep prev_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  rb = (size_t)prev;
  prev_local = row;
  for (zero[1] = row_info->rowbytes + 4; 4 < (ulong)zero[1]; zero[1] = zero[1] + -4) {
    load4((void *)rb);
    ppVar1 = prev_local;
    load4(prev_local);
    x[1] = (longlong)row;
    x[0] = (longlong)ppVar1;
    abs_i16(x);
    x_00[1] = (longlong)row;
    x_00[0] = (longlong)ppVar1;
    abs_i16(x_00);
    x_01[1] = (longlong)row;
    x_01[0] = (longlong)ppVar1;
    alVar2 = abs_i16(x_01);
    t[0] = alVar2[1];
    c_00[1] = (longlong)row;
    c_00[0] = (longlong)ppVar1;
    t[1] = in_RCX;
    e[1] = in_R9;
    e[0] = in_R8;
    alVar2 = if_then_else(c_00,t,e);
    t_00[0] = alVar2[1];
    c_01[1] = (longlong)row;
    c_01[0] = (longlong)ppVar1;
    t_00[1] = in_RCX;
    e_00[1] = in_R9;
    e_00[0] = in_R8;
    alVar2 = if_then_else(c_01,t_00,e_00);
    alVar2[0] = (longlong)row;
    store4(prev_local,alVar2);
    rb = rb + 4;
    prev_local = prev_local + 4;
  }
  return;
}

Assistant:

void png_read_filter_row_paeth4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* Paeth tries to predict pixel d using the pixel to the left of it, a,
    * and two pixels from the previous row, b and c:
    *   prev: c b
    *   row:  a d
    * The Paeth function predicts d to be whichever of a, b, or c is nearest to
    * p=a+b-c.
    *
    * The first pixel has no left context, and so uses an Up filter, p = b.
    * This works naturally with our main loop's p = a+b-c if we force a and c
    * to zero.
    * Here we zero b and d, which become c and a respectively at the start of
    * the loop.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i pa,pb,pc,smallest,nearest;
   __m128i c, b = zero,
           a, d = zero;

   png_debug(1, "in png_read_filter_row_paeth4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      c = b; b = _mm_unpacklo_epi8(load4(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load4(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                         if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                                     c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store4(row, _mm_packus_epi16(d,d));

      prev += 4;
      row  += 4;
      rb   -= 4;
   }
}